

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v8::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::move
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  char *pcVar1;
  size_t __n;
  size_t sVar2;
  char *__src;
  
  pcVar1 = (other->super_buffer<char>).ptr_;
  __n = (other->super_buffer<char>).size_;
  sVar2 = (other->super_buffer<char>).capacity_;
  __src = other->store_;
  if (pcVar1 == __src) {
    (this->super_buffer<char>).ptr_ = this->store_;
    (this->super_buffer<char>).capacity_ = sVar2;
    if (__n != 0) {
      memmove(this->store_,__src,__n);
    }
  }
  else {
    (this->super_buffer<char>).ptr_ = pcVar1;
    (this->super_buffer<char>).capacity_ = sVar2;
    (other->super_buffer<char>).ptr_ = __src;
    (other->super_buffer<char>).capacity_ = 0;
  }
  detail::buffer<char>::try_resize(&this->super_buffer<char>,__n);
  return;
}

Assistant:

FMT_CONSTEXPR20 void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      if (detail::is_constant_evaluated()) {
        detail::copy_str<T>(other.store_, other.store_ + size,
                            detail::make_checked(store_, capacity));
      } else {
        std::uninitialized_copy(other.store_, other.store_ + size,
                                detail::make_checked(store_, capacity));
      }
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
    }
    this->resize(size);
  }